

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O1

void __thiscall xLearn::Predictor::Predict(Predictor *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  vector<float,_std::allocator<float>_> *siglen;
  ulong uVar4;
  Predictor *this_00;
  uchar *in_R8;
  size_t in_R9;
  vector<float,std::allocator<float>> *pvVar5;
  ulong uVar6;
  float fVar7;
  undefined8 in_XMM0_Qa;
  Modifier reset;
  DMatrix *matrix;
  Modifier green;
  ofstream o_file;
  Modifier local_264;
  long local_260;
  undefined8 local_258;
  char *local_250;
  vector<float,std::allocator<float>> *local_248;
  string *local_240;
  Modifier local_234;
  undefined1 local_230 [8];
  size_type local_228;
  char local_220 [232];
  ios_base local_138 [264];
  
  if (this->res_out_ == true) {
    std::ofstream::ofstream(local_230,(string *)&this->out_file_,_S_out);
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_228);
    in_XMM0_Qa = std::ios_base::~ios_base(local_138);
  }
  if (Predict()::out == '\0') {
    Predict();
  }
  local_260 = 0;
  (*this->reader_->_vptr_Reader[5])();
  (*this->loss_->_vptr_Loss[7])();
  pvVar5 = (vector<float,std::allocator<float>> *)&this->out_;
  local_240 = (string *)&this->out_file_;
  local_250 = _VTT;
  local_258 = ___throw_bad_array_new_length;
  local_248 = pvVar5;
  do {
    uVar2 = (*this->reader_->_vptr_Reader[4])(this->reader_,&local_260);
    fVar7 = (float)in_XMM0_Qa;
    if (uVar2 == 0) break;
    if ((long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)uVar2) {
      std::vector<float,_std::allocator<float>_>::resize(&Predict::out,(ulong)uVar2);
    }
    this_00 = (Predictor *)this->loss_;
    siglen = &Predict::out;
    (*(code *)(this_00->reader_->filename_).field_2._M_allocated_capacity)
              (this_00,local_260,this->model_);
    if (this->reader_->has_label_ == true) {
      this_00 = (Predictor *)this->loss_;
      (*(code *)(this_00->reader_->filename_)._M_string_length)
                (this_00,&Predict::out,local_260 + 0x30);
    }
    if (this->sigmoid_ == true) {
      sigmoid(this_00,&Predict::out,&Predict::out);
    }
    else if (this->sign_ == true) {
      sign(this_00,(EVP_PKEY_CTX *)&Predict::out,(uchar *)&Predict::out,(size_t *)siglen,in_R8,in_R9
          );
    }
    std::vector<float,std::allocator<float>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              (pvVar5,(this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish,
               Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (this->res_out_ == true) {
      std::ofstream::ofstream(local_230,local_240,_S_app);
      if (Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        uVar6 = 1;
        do {
          poVar3 = std::ostream::_M_insert<double>
                             ((double)Predict::out.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          bVar1 = uVar6 < (ulong)((long)Predict::out.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)Predict::out.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2);
          uVar4 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar1);
      }
      local_230 = (undefined1  [8])local_250;
      *(undefined8 *)(local_230 + *(long *)(local_250 + -0x18)) = local_258;
      std::filebuf::~filebuf((filebuf *)&local_228);
      in_XMM0_Qa = std::ios_base::~ios_base(local_138);
      pvVar5 = local_248;
    }
    fVar7 = (float)in_XMM0_Qa;
  } while (uVar2 != 0);
  if (this->reader_->has_label_ == true) {
    (*this->loss_->_vptr_Loss[6])();
    StringPrintf_abi_cxx11_((string *)local_230,"The test loss is: %.6f",(double)fVar7);
    local_234.code = FG_GREEN;
    local_264.code = RESET;
    poVar3 = Color::operator<<((ostream *)&std::cout,&local_234);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
    poVar3 = Color::operator<<(poVar3,&local_264);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_230,local_228);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
  }
  return;
}

Assistant:

void Predictor::Predict() {
  if (res_out_)
    std::ofstream o_file(out_file_);
  static std::vector<real_t> out;
  DMatrix* matrix = nullptr;
  reader_->Reset();
  loss_->Reset();
  for (;;) {
    index_t tmp = reader_->Samples(matrix);
    if (tmp == 0) { break; }
    if (tmp != out.size()) { out.resize(tmp); }
    loss_->Predict(matrix, *model_, out);
    if (reader_->has_label()) {
      loss_->Evaluate(out, matrix->Y);
    }
    if (sigmoid_) {
      this->sigmoid(out, out);
    } else if (sign_) {
      this->sign(out, out);
    }
    this->out_.insert(this->out_.end(), out.begin(), out.end());
    if (res_out_) {
      std::ofstream o_file(out_file_, std::ofstream::app);
      for (index_t i = 0; i < out.size(); ++i) {
        o_file << out[i] << "\n";
      }
    }
  }
  if (reader_->has_label()) {
    Color::print_info(
      StringPrintf("The test loss is: %.6f", 
        loss_->GetLoss())
    );
  }
}